

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_free(archive_write *a)

{
  xar_conflict *xar_00;
  xar_conflict *xar;
  archive_write *a_local;
  
  xar_00 = (xar_conflict *)a->format_data;
  if (-1 < xar_00->temp_fd) {
    close(xar_00->temp_fd);
  }
  archive_string_free(&xar_00->cur_dirstr);
  archive_string_free(&xar_00->tstr);
  archive_string_free(&xar_00->vstr);
  file_free_hardlinks(xar_00);
  file_free_register(xar_00);
  compression_end(&a->archive,&xar_00->stream);
  free(xar_00);
  return 0;
}

Assistant:

static int
xar_free(struct archive_write *a)
{
	struct xar *xar;

	xar = (struct xar *)a->format_data;

	/* Close the temporary file. */
	if (xar->temp_fd >= 0)
		close(xar->temp_fd);

	archive_string_free(&(xar->cur_dirstr));
	archive_string_free(&(xar->tstr));
	archive_string_free(&(xar->vstr));
	file_free_hardlinks(xar);
	file_free_register(xar);
	compression_end(&(a->archive), &(xar->stream));
	free(xar);

	return (ARCHIVE_OK);
}